

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.cpp
# Opt level: O0

optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *
DecodeBase32(string_view str)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  const_iterator pvVar4;
  const_iterator pvVar5;
  optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *in_RDI;
  long in_FS_OFFSET;
  bool valid;
  vector<unsigned_char,_std::allocator<unsigned_char>_> ret;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff28;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff30;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff38;
  optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *this;
  char *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  size_t in_stack_ffffffffffffff50;
  optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *__n;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined1 local_50 [56];
  undefined8 local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __n = in_RDI;
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(in_stack_ffffffffffffff28);
  if ((sVar2 & 7) == 0) {
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(in_stack_ffffffffffffff28);
    if ((sVar2 != 0) &&
       (pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::back
                           (in_stack_ffffffffffffff38), *pvVar3 == '=')) {
      std::basic_string_view<char,_std::char_traits<char>_>::remove_suffix
                (in_stack_ffffffffffffff28,0x1ae311);
    }
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(in_stack_ffffffffffffff28);
    if (1 < sVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::size(in_stack_ffffffffffffff28);
      std::basic_string_view<char,_std::char_traits<char>_>::substr
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                 (size_type)in_stack_ffffffffffffff40,(size_type)in_RDI);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                 in_stack_ffffffffffffff40);
      __x._M_str._0_4_ = in_stack_ffffffffffffff68;
      __x._M_len = (size_t)__n;
      __x._M_str._4_4_ = in_stack_ffffffffffffff6c;
      __y._M_str = (char *)in_RDI;
      __y._M_len = in_stack_ffffffffffffff50;
      bVar1 = std::operator==(__x,__y);
      if (bVar1) {
        std::basic_string_view<char,_std::char_traits<char>_>::remove_suffix
                  (in_stack_ffffffffffffff28,0x1ae3a1);
      }
    }
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(in_stack_ffffffffffffff28);
    if ((sVar2 != 0) &&
       (pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::back
                           (in_stack_ffffffffffffff38), *pvVar3 == '=')) {
      std::basic_string_view<char,_std::char_traits<char>_>::remove_suffix
                (in_stack_ffffffffffffff28,0x1ae3db);
    }
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(in_stack_ffffffffffffff28);
    if (1 < sVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::size(in_stack_ffffffffffffff28);
      std::basic_string_view<char,_std::char_traits<char>_>::substr
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                 (size_type)in_stack_ffffffffffffff40,(size_type)in_RDI);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                 in_stack_ffffffffffffff40);
      __x_00._M_str._0_4_ = in_stack_ffffffffffffff68;
      __x_00._M_len = (size_t)__n;
      __x_00._M_str._4_4_ = in_stack_ffffffffffffff6c;
      __y_00._M_str = (char *)in_RDI;
      __y_00._M_len = in_stack_ffffffffffffff50;
      bVar1 = std::operator==(__x_00,__y_00);
      if (bVar1) {
        std::basic_string_view<char,_std::char_traits<char>_>::remove_suffix
                  (in_stack_ffffffffffffff28,0x1ae46b);
      }
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff28);
    std::basic_string_view<char,_std::char_traits<char>_>::size(in_stack_ffffffffffffff28);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),(size_type)__n);
    this = (optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
           &stack0xffffffffffffffe8;
    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::begin(in_stack_ffffffffffffff28)
    ;
    pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::end(in_stack_ffffffffffffff28);
    bVar1 = ConvertBits<5,8,false,DecodeBase32(std::basic_string_view<char,std::char_traits<char>>)::__0,char_const*,DecodeBase32(std::basic_string_view<char,std::char_traits<char>>)::__1>
                      (local_50,pvVar4,pvVar5);
    if (bVar1) {
      std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
      optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true>
                (this,in_stack_ffffffffffffff30);
    }
    else {
      std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::optional
                ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                 in_stack_ffffffffffffff28);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  }
  else {
    std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::optional
              ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
               in_stack_ffffffffffffff28);
  }
  if (*(pointer *)(in_FS_OFFSET + 0x28) != (pointer)local_8) {
    __stack_chk_fail();
  }
  return __n;
}

Assistant:

std::optional<std::vector<unsigned char>> DecodeBase32(std::string_view str)
{
    static const int8_t decode32_table[256]{
        -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
        -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
        -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, 26, 27, 28, 29, 30, 31, -1, -1, -1, -1,
        -1, -1, -1, -1, -1,  0,  1,  2,  3,  4,  5,  6,  7,  8,  9, 10, 11, 12, 13, 14,
        15, 16, 17, 18, 19, 20, 21, 22, 23, 24, 25, -1, -1, -1, -1, -1, -1,  0,  1,  2,
         3,  4,  5,  6,  7,  8,  9, 10, 11, 12, 13, 14, 15, 16, 17, 18, 19, 20, 21, 22,
        23, 24, 25, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
        -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
        -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
        -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
        -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
        -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
        -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1
    };

    if (str.size() % 8 != 0) return {};
    /* 1, 3, 4, or 6 padding '=' suffix characters are permitted. */
    if (str.size() >= 1 && str.back() == '=') str.remove_suffix(1);
    if (str.size() >= 2 && str.substr(str.size() - 2) == "==") str.remove_suffix(2);
    if (str.size() >= 1 && str.back() == '=') str.remove_suffix(1);
    if (str.size() >= 2 && str.substr(str.size() - 2) == "==") str.remove_suffix(2);

    std::vector<unsigned char> ret;
    ret.reserve((str.size() * 5) / 8);
    bool valid = ConvertBits<5, 8, false>(
        [&](unsigned char c) { ret.push_back(c); },
        str.begin(), str.end(),
        [](char c) { return decode32_table[uint8_t(c)]; }
    );

    if (!valid) return {};

    return ret;
}